

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

string * __thiscall FunctionPointerType::defToString_abi_cxx11_(FunctionPointerType *this)

{
  ulong uVar1;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string local_a0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+(__lhs,in_stack_ffffffffffffff00);
    std::operator+(__lhs,in_stack_ffffffffffffff00);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::__cxx11::string::~string(local_e0);
  }
  else {
    __rhs = &local_70;
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return in_RDI;
}

Assistant:

std::string FunctionPointerType::defToString() const {
    if (typeEnd.empty()) {
        return "typedef " + type + " " + name + ";";
    }

    return "typedef " + type + name + typeEnd + ";";
}